

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(ExtensionSet *this,int key)

{
  bool bVar1;
  Extension *pEVar2;
  reference ppVar3;
  iterator iVar4;
  const_iterator it;
  int local_24;
  btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_20;
  
  local_24 = key;
  if ((short)this->flat_size_ < 0) {
    iVar4 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::find<int>((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)(this->map_).flat,&local_24);
    local_20.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          *)iVar4.node_;
    local_20.position_ = iVar4.position_;
    iVar4 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)(this->map_).flat);
    bVar1 = absl::lts_20240722::container_internal::
            btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
            ::Equals(&local_20,(const_iterator)iVar4);
    if (bVar1) {
      pEVar2 = (Extension *)0x0;
    }
    else {
      ppVar3 = absl::lts_20240722::container_internal::
               btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator*(&local_20);
      pEVar2 = &ppVar3->second;
    }
    return pEVar2;
  }
  __assert_fail("is_large()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                ,0x663,
                "const ExtensionSet::Extension *google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(int) const"
               );
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNullInLargeMap(
    int key) const {
  assert(is_large());
  LargeMap::const_iterator it = map_.large->find(key);
  if (it != map_.large->end()) {
    return &it->second;
  }
  return nullptr;
}